

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O3

QString * __thiscall
Win32MakefileGenerator::escapeDependencyPath
          (QString *__return_storage_ptr__,Win32MakefileGenerator *this,QString *path)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  qsizetype qVar3;
  char cVar4;
  long lVar5;
  QString *pQVar6;
  char16_t *pcVar7;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<const_char_(&)[2],_QString_&>,_const_char_(&)[2]> local_60;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (path->d).d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (path->d).ptr;
  lVar5 = (path->d).size;
  (__return_storage_ptr__->d).size = lVar5;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    lVar5 = (__return_storage_ptr__->d).size;
  }
  if (lVar5 != 0) {
    if (escapeDependencyPath(QString_const&)::criticalChars == '\0') {
      escapeDependencyPath();
    }
    cVar4 = QString::contains((QRegularExpression *)__return_storage_ptr__,
                              (QRegularExpressionMatch *)
                              &escapeDependencyPath(QString_const&)::criticalChars);
    if (cVar4 != '\0') {
      local_60.a.a = (char (*) [2])0x2b5765;
      local_60.b = (char (*) [2])0x2b5765;
      local_60.a.b = __return_storage_ptr__;
      QStringBuilder<QStringBuilder<const_char_(&)[2],_QString_&>,_const_char_(&)[2]>::
      convertTo<QString>(&local_48,&local_60);
      pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar7 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_48.d.d;
      (__return_storage_ptr__->d).ptr = local_48.d.ptr;
      qVar3 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_48.d.size;
      local_48.d.d = (Data *)pQVar2;
      local_48.d.ptr = pcVar7;
      local_48.d.size = qVar3;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
    }
    if (Option::debug_level != 0) {
      QString::toLatin1_helper((QString *)&local_48);
      pcVar7 = local_48.d.ptr;
      if (local_48.d.ptr == (char16_t *)0x0) {
        pcVar7 = (char16_t *)&QByteArray::_empty;
      }
      QString::toLatin1_helper((QString *)&local_60);
      pQVar6 = local_60.a.b;
      if (local_60.a.b == (QString *)0x0) {
        pQVar6 = (QString *)&QByteArray::_empty;
      }
      debug_msg_internal(2,"EscapeDependencyPath: %s -> %s",pcVar7,pQVar6);
      if ((QArrayData *)local_60.a.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)*local_60.a.a)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)*local_60.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)*local_60.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_60.a.a,1,0x10);
        }
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString Win32MakefileGenerator::escapeDependencyPath(const QString &path) const
{
    QString ret = path;
    if (!ret.isEmpty()) {
        static const QRegularExpression criticalChars(QStringLiteral("([\t #])"));
        if (ret.contains(criticalChars))
            ret = "\"" + ret + "\"";
        debug_msg(2, "EscapeDependencyPath: %s -> %s", path.toLatin1().constData(), ret.toLatin1().constData());
    }
    return ret;
}